

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O2

void __thiscall indk::NeuralNet::doInterlinkSyncStructure(NeuralNet *this)

{
  Interlink *this_00;
  bool bVar1;
  string sStack_38;
  
  if (this->InterlinkService != (Interlink *)0x0) {
    bVar1 = Interlink::isInterlinked(this->InterlinkService);
    if (bVar1) {
      this_00 = this->InterlinkService;
      getStructure_abi_cxx11_(&sStack_38,this,true);
      Interlink::doUpdateStructure(this_00,&sStack_38);
      std::__cxx11::string::~string((string *)&sStack_38);
    }
  }
  return;
}

Assistant:

void indk::NeuralNet::doInterlinkSyncStructure() {
    if (!InterlinkService || InterlinkService && !InterlinkService->isInterlinked()) return;
    InterlinkService -> doUpdateStructure(getStructure());
}